

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bs.cc
# Opt level: O3

void bs_predict_vote(example *ec,vector<double,_std::allocator<double>_> *pred_vec)

{
  pointer pdVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  pointer pdVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  pointer pdVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  bool bVar19;
  double dVar20;
  int local_54;
  
  pdVar1 = (pred_vec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (pred_vec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar12 = (long)pdVar7 - (long)pdVar1 >> 3;
  uVar14 = 0;
  piVar6 = (int *)operator_new__(-(ulong)(uVar12 >> 0x3e != 0) | (long)pdVar7 - (long)pdVar1 >> 1);
  if (pdVar7 == pdVar1) {
    iVar18 = 1;
  }
  else {
    iVar16 = 0;
    local_54 = 1;
    iVar11 = 1;
    bVar19 = false;
    do {
      while( true ) {
        dVar20 = floor(pdVar1[uVar14] + 0.5);
        iVar17 = (int)dVar20;
        piVar6[uVar14] = iVar17;
        iVar15 = (int)uVar14;
        iVar18 = iVar11;
        iVar4 = local_54;
        bVar3 = bVar19;
        if ((!bVar19) && (iVar18 = iVar17, iVar4 = iVar17, iVar15 != 0)) {
          bVar3 = true;
          if (local_54 == iVar17) {
            bVar3 = bVar19;
          }
          if (iVar11 == iVar17) {
            bVar3 = bVar19;
          }
          iVar18 = iVar11;
          iVar4 = local_54;
          if (local_54 == iVar11) {
            bVar3 = bVar19;
          }
        }
        local_54 = iVar4;
        bVar19 = bVar3;
        if (iVar16 == 0) break;
        iVar16 = iVar16 + -1 + (uint)(iVar18 == iVar17) * 2;
        uVar14 = (ulong)(iVar15 + 1);
        iVar11 = iVar18;
        if (uVar12 <= uVar14) {
          if (iVar16 == 0) {
            bVar19 = false;
            goto LAB_001f40d6;
          }
          goto LAB_001f406c;
        }
      }
      uVar14 = (ulong)(iVar15 + 1);
      iVar16 = 1;
      iVar18 = iVar17;
      iVar11 = iVar17;
    } while (uVar14 < uVar12);
LAB_001f406c:
    if (bVar3) {
      uVar14 = 0;
      if (pdVar7 != pdVar1) {
        uVar9 = 0;
        do {
          uVar5 = (int)uVar14 + (uint)(piVar6[uVar9] == iVar18);
          uVar14 = (ulong)uVar5;
          uVar9 = uVar9 + 1;
        } while ((uVar9 & 0xffffffff) < uVar12);
        uVar14 = (ulong)(uVar5 * 2);
      }
      bVar19 = uVar12 < uVar14;
      bVar3 = true;
LAB_001f40d6:
      if ((!bVar19) && (bVar3)) {
        pdVar13 = pdVar7;
        if (pdVar7 != pdVar1) {
          lVar2 = 0x3f;
          if (uVar12 != 0) {
            for (; uVar12 >> lVar2 == 0; lVar2 = lVar2 + -1) {
            }
          }
          std::__introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (piVar6,piVar6 + uVar12,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
          std::__final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>
                    (piVar6,piVar6 + uVar12);
          pdVar7 = (pred_vec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          pdVar13 = (pred_vec->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
        }
        uVar12 = (long)pdVar7 - (long)pdVar13 >> 3;
        if (1 < uVar12) {
          iVar11 = *piVar6;
          uVar8 = 1;
          uVar14 = 1;
          uVar10 = 2;
          uVar5 = 1;
          do {
            if (iVar11 == piVar6[uVar14]) {
              uVar8 = uVar8 + 1;
            }
            else {
              if (uVar5 < uVar8) {
                uVar5 = uVar8;
                iVar18 = iVar11;
              }
              uVar8 = 1;
              iVar11 = piVar6[uVar14];
            }
            uVar14 = (ulong)uVar10;
            uVar10 = uVar10 + 1;
          } while (uVar14 < uVar12);
        }
      }
    }
  }
  operator_delete__(piVar6);
  (ec->pred).scalar = (float)iVar18;
  ec->loss = (float)(~-(uint)((float)iVar18 == (ec->l).simple.label) & 0x3f800000) * ec->weight;
  return;
}

Assistant:

void bs_predict_vote(example& ec, vector<double>& pred_vec)
{
  // majority vote in linear time
  unsigned int counter = 0;
  int current_label = 1, init_label = 1;
  // float sum_labels = 0; // uncomment for: "avg on votes" and getLoss()
  bool majority_found = false;
  bool multivote_detected = false;  // distinct(votes)>2: used to skip part of the algorithm
  auto pred_vec_sz = pred_vec.size();
  int* pred_vec_int = new int[pred_vec_sz];

  for (unsigned int i = 0; i < pred_vec_sz; i++)
  {
    pred_vec_int[i] = (int)floor(
        pred_vec[i] + 0.5);  // could be added: link(), min_label/max_label, cutoff between true/false for binary

    if (multivote_detected == false)  // distinct(votes)>2 detection bloc
    {
      if (i == 0)
      {
        init_label = pred_vec_int[i];
        current_label = pred_vec_int[i];
      }
      else if (init_label != current_label && pred_vec_int[i] != current_label && pred_vec_int[i] != init_label)
        multivote_detected = true;  // more than 2 distinct votes detected
    }

    if (counter == 0)
    {
      counter = 1;
      current_label = pred_vec_int[i];
    }
    else
    {
      if (pred_vec_int[i] == current_label)
        counter++;
      else
      {
        counter--;
      }
    }
  }

  if (counter > 0 && multivote_detected)  // remove this condition for: "avg on votes" and getLoss()
  {
    counter = 0;
    for (unsigned int i = 0; i < pred_vec.size(); i++)
      if (pred_vec_int[i] == current_label)
      {
        counter++;
        // sum_labels += pred_vec[i]; // uncomment for: "avg on votes" and getLoss()
      }
    if (counter * 2 > pred_vec.size())
      majority_found = true;
  }

  if (multivote_detected && majority_found == false)  // then find most frequent element - if tie: smallest tie label
  {
    std::sort(pred_vec_int, pred_vec_int + pred_vec.size());
    int tmp_label = pred_vec_int[0];
    counter = 1;
    for (unsigned int i = 1, temp_count = 1; i < pred_vec.size(); i++)
    {
      if (tmp_label == pred_vec_int[i])
        temp_count++;
      else
      {
        if (temp_count > counter)
        {
          current_label = tmp_label;
          counter = temp_count;
        }
        tmp_label = pred_vec_int[i];
        temp_count = 1;
      }
    }
    /* uncomment for: "avg on votes" and getLoss()
    sum_labels = 0;
    for(unsigned int i=0; i<pred_vec.size(); i++)
      if(pred_vec_int[i] == current_label)
        sum_labels += pred_vec[i]; */
  }
  // TODO: unique_ptr would also handle exception case
  delete[] pred_vec_int;

  // ld.prediction = sum_labels/(float)counter; //replace line below for: "avg on votes" and getLoss()
  ec.pred.scalar = (float)current_label;

  // ec.loss = all.loss->getLoss(all.sd, ld.prediction, ld.label) * ec.weight; //replace line below for: "avg on votes"
  // and getLoss()
  ec.loss = ((ec.pred.scalar == ec.l.simple.label) ? 0.f : 1.f) * ec.weight;
}